

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::relevantChannelRules
          (DwaCompressor *this,
          vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
          *rules)

{
  pointer pCVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suffixes;
  string suffix;
  string local_50 [32];
  
  std::
  vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>::
  clear(rules);
  suffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  suffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  suffixes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 0;
  for (uVar4 = 0;
      pCVar1 = (this->_channelData).
               super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->_channelData).
                             super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x98);
      uVar4 = uVar4 + 1) {
    std::__cxx11::string::string
              ((string *)&suffix,(string *)((long)pCVar1->planarUncRle + lVar5 + -0x50));
    lVar3 = std::__cxx11::string::rfind((char)&suffix,0x2e);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&suffix);
      std::__cxx11::string::operator=((string *)&suffix,local_50);
      std::__cxx11::string::~string(local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&suffixes,&suffix);
    std::__cxx11::string::~string((string *)&suffix);
    lVar5 = lVar5 + 0x98;
  }
  uVar4 = 0;
  do {
    uVar6 = 0xffffffffffffffff;
    if ((ulong)(((long)(this->_channelRules).
                       super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->_channelRules).
                      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&suffixes);
      return;
    }
    lVar3 = 0;
    lVar5 = 0x2c;
    do {
      pCVar1 = (this->_channelData).
               super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
      if ((ulong)(((long)(this->_channelData).
                         super__Vector_base<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x98) <= uVar6
         ) goto LAB_001306ed;
      bVar2 = Classifier::match((this->_channelRules).
                                super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar4,
                                (string *)
                                ((long)&((suffixes.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar3),
                                *(PixelType *)((long)pCVar1->planarUncRle + lVar5 + -0x50));
      lVar5 = lVar5 + 0x98;
      lVar3 = lVar3 + 0x20;
    } while (!bVar2);
    std::
    vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
    ::push_back(rules,(this->_channelRules).
                      super__Vector_base<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar4);
LAB_001306ed:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void
DwaCompressor::relevantChannelRules (std::vector<Classifier> &rules) const 
{
    rules.clear();

    std::vector<std::string> suffixes;
    
    for (size_t cd = 0; cd < _channelData.size(); ++cd) 
    {
        std::string suffix  = _channelData[cd].name;
        size_t      lastDot = suffix.find_last_of ('.');

        if (lastDot != std::string::npos)
            suffix = suffix.substr (lastDot+1, std::string::npos);

        suffixes.push_back(suffix);
    }

    
    for (size_t i = 0; i < _channelRules.size(); ++i) 
    {
        for (size_t cd = 0; cd < _channelData.size(); ++cd) 
        {
            if (_channelRules[i].match (suffixes[cd], _channelData[cd].type ))
            {
                rules.push_back (_channelRules[i]);
                break;
            }
        }       
    }
}